

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_nil(FuncState *fs,int from,int n)

{
  int iVar1;
  uint uVar2;
  Instruction *pIVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  iVar1 = fs->pc;
  if (fs->lasttarget < iVar1) {
    pIVar3 = fs->f->code;
    uVar2 = pIVar3[(long)iVar1 + -1];
    if ((uVar2 & 0x3f) == 4) {
      uVar6 = uVar2 >> 6 & 0xff;
      if ((from <= (int)(uVar6 + (uVar2 >> 0x17) + 1) && (int)uVar6 <= from) ||
         ((int)uVar6 <= n + from && from <= (int)uVar6)) {
        iVar5 = (uVar2 >> 0x17) + uVar6;
        uVar4 = from;
        if ((int)uVar6 < from) {
          uVar4 = uVar6;
        }
        if (iVar5 < n + from) {
          iVar5 = n + from + 0x1ff;
        }
        pIVar3[(long)iVar1 + -1] =
             (iVar5 - uVar4) * 0x800000 | (uVar4 & 0xff) << 6 | uVar2 & 0x7fc004;
        return;
      }
    }
  }
  luaK_codeABC(fs,OP_LOADNIL,from,n + -1,0);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  Instruction *previous;
  int l = from + n - 1;  /* last register to set nil */
  if (fs->pc > fs->lasttarget) {  /* no jumps to current position? */
    previous = &fs->f->code[fs->pc-1];
    if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
      int pfrom = GETARG_A(*previous);  /* get previous range */
      int pl = pfrom + GETARG_B(*previous);
      if ((pfrom <= from && from <= pl + 1) ||
          (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
        if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
        if (pl > l) l = pl;  /* l = max(l, pl) */
        SETARG_A(*previous, from);
        SETARG_B(*previous, l - from);
        return;
      }
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}